

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode cf_socket_open(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_sockaddr_ex *addr;
  uint *sockfd;
  undefined1 *puVar1;
  uchar uVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  undefined8 uVar6;
  _Bool _Var7;
  uchar uVar8;
  CURLcode CVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  if2ip_result_t iVar13;
  resolve_t rVar14;
  curl_trc_feat *pcVar15;
  int *piVar16;
  size_t sVar17;
  uint *puVar18;
  char *pcVar19;
  socklen_t __len;
  uint uVar20;
  ulong uVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  ushort uVar25;
  connectdata *pcVar26;
  ushort uVar27;
  bool bVar28;
  curltime cVar29;
  Curl_dns_entry *h;
  int on;
  curl_off_t scope_id;
  Curl_sockaddr_storage sa;
  char buffer [256];
  curl_socklen_t onoff;
  Curl_dns_entry *local_2e0;
  char *local_2d8;
  uint local_2d0;
  undefined4 local_2cc;
  connectdata *local_2c8;
  undefined4 local_2c0 [2];
  sockaddr local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  char local_238 [256];
  char *local_138 [33];
  
  pvVar3 = cf->ctx;
  cVar29 = Curl_now();
  *(time_t *)((long)pvVar3 + 0x100) = cVar29.tv_sec;
  *(int *)((long)pvVar3 + 0x108) = cVar29.tv_usec;
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    *(byte *)((long)pvVar3 + 0xd) = *(byte *)((long)pvVar3 + 0xd) | 8;
  }
  addr = (Curl_sockaddr_ex *)((long)pvVar3 + 8);
  sockfd = (uint *)((long)pvVar3 + 0x98);
  CVar9 = socket_open(data,addr,(curl_socket_t *)sockfd);
  uVar21 = (ulong)CVar9;
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    *(byte *)((long)pvVar3 + 0xd) = *(byte *)((long)pvVar3 + 0xd) & 0xf7;
  }
  if (CVar9 == CURLE_OK) {
    pvVar4 = cf->ctx;
    _Var7 = Curl_addr2string((sockaddr *)((long)pvVar4 + 0x18),
                             *(curl_socklen_t *)((long)pvVar4 + 0x14),(char *)((long)pvVar4 + 0x9c),
                             (int *)((long)pvVar4 + 0xf8));
    if (!_Var7) {
      puVar18 = (uint *)__errno_location();
      uVar20 = *puVar18;
      *(uint *)((long)pvVar4 + 0x130) = uVar20;
      pcVar22 = Curl_strerror(uVar20,local_238,0x100);
      Curl_failf(data,"curl_sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar20,pcVar22);
      uVar21 = 2;
      goto LAB_001177d3;
    }
    uVar20 = (uint)*(undefined8 *)&(data->set).field_0x894;
    if (addr->family == 10) {
      if ((uVar20 >> 0x1e & 1) != 0) {
        pcVar15 = (data->state).feat;
        pcVar22 = "  Trying [%s]:%d...";
LAB_0011786d:
        if ((pcVar15 == (curl_trc_feat *)0x0) || (0 < pcVar15->log_level)) {
          Curl_infof(data,pcVar22,(long)pvVar3 + 0x9c,(ulong)*(uint *)((long)pvVar3 + 0xf8));
        }
      }
    }
    else if ((uVar20 >> 0x1e & 1) != 0) {
      pcVar15 = (data->state).feat;
      pcVar22 = "  Trying %s:%d...";
      goto LAB_0011786d;
    }
    if (((addr->family | 8U) == 10) && (*(int *)((long)pvVar3 + 0xc) == 1)) {
      uVar21 = *(ulong *)&(data->set).field_0x894;
      if ((uVar21 >> 0x22 & 1) != 0) {
        local_138[0] = (char *)CONCAT44(local_138[0]._4_4_,1);
        iVar10 = setsockopt(*sockfd,6,1,local_138,4);
        uVar21 = *(ulong *)&(data->set).field_0x894;
        if ((((uint)uVar21 >> 0x1e & 1) != 0 && iVar10 < 0) &&
           ((pcVar15 = (data->state).feat, pcVar15 == (curl_trc_feat *)0x0 ||
            (0 < pcVar15->log_level)))) {
          piVar16 = __errno_location();
          pcVar22 = Curl_strerror(*piVar16,local_238,0x100);
          Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar22);
          uVar21 = *(ulong *)&(data->set).field_0x894;
        }
      }
      if ((uVar21 >> 0x28 & 1) != 0) {
        tcpkeepalive(data,*sockfd);
      }
    }
    if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_001179a5:
      bVar5 = false;
    }
    else {
      Curl_set_in_callback(data,true);
      iVar10 = (*(data->set).fsockopt)((data->set).sockopt_client,*sockfd,CURLSOCKTYPE_IPCXN);
      Curl_set_in_callback(data,false);
      if (iVar10 != 2) {
        uVar21 = 0x2a;
        if (iVar10 != 0) goto LAB_001177d3;
        goto LAB_001179a5;
      }
      bVar5 = true;
    }
    uVar20 = addr->family;
    if ((uVar20 | 8) == 10) {
      pcVar26 = cf->conn;
      iVar10 = *(int *)((long)pvVar3 + 0x98);
      uVar11 = Curl_ipv6_scope((sockaddr *)((long)pvVar3 + 0x18));
      local_2e0 = (Curl_dns_entry *)0x0;
      uVar27 = (data->set).localport;
      pcVar22 = (data->set).str[0x1e];
      pcVar19 = (data->set).str[0x1f];
      pcVar24 = pcVar19;
      if (pcVar19 == (char *)0x0) {
        pcVar24 = pcVar22;
      }
      pcVar23 = (data->set).str[0x20];
      local_2cc = 1;
      if ((uVar27 != 0 || (pcVar23 != (char *)0x0 || pcVar22 != (char *)0x0)) ||
          pcVar24 != (char *)0x0) {
        local_2d0 = (uint)(data->set).localportrange;
        local_2c8 = pcVar26;
        if (pcVar24 == (char *)0x0) {
          local_248 = 0;
          uStack_240 = 0;
          local_258 = 0;
          uStack_250 = 0;
          local_268 = 0;
          uStack_260 = 0;
          local_278 = 0;
          uStack_270 = 0;
          local_288 = 0;
          uStack_280 = 0;
          local_298 = 0;
          uStack_290 = 0;
          local_2a8 = 0;
          uStack_2a0 = 0;
          local_2b8.sa_family = 0;
          local_2b8.sa_data[0] = '\0';
          local_2b8.sa_data[1] = '\0';
          local_2b8.sa_data[2] = '\0';
          local_2b8.sa_data[3] = '\0';
          local_2b8.sa_data[4] = '\0';
          local_2b8.sa_data[5] = '\0';
          uVar6 = local_2b8._0_8_;
          local_2b8.sa_data[6] = '\0';
          local_2b8.sa_data[7] = '\0';
          local_2b8.sa_data[8] = '\0';
          local_2b8.sa_data[9] = '\0';
          local_2b8.sa_data[10] = '\0';
          local_2b8.sa_data[0xb] = '\0';
          local_2b8.sa_data[0xc] = '\0';
          local_2b8.sa_data[0xd] = '\0';
          if (pcVar23 == (char *)0x0 && pcVar22 == (char *)0x0) {
            local_2b8.sa_data[2] = '\0';
            local_2b8.sa_data[3] = '\0';
            local_2b8.sa_data[4] = '\0';
            local_2b8.sa_data[5] = '\0';
            if (uVar20 == 2) {
LAB_00117e9f:
              local_2b8.sa_data._0_2_ = uVar27 << 8 | uVar27 >> 8;
              local_2b8.sa_family = 2;
              local_2b8.sa_data[2] = local_2b8.sa_data[2];
              local_2b8.sa_data[3] = local_2b8.sa_data[3];
              local_2b8.sa_data[4] = local_2b8.sa_data[4];
              local_2b8.sa_data[5] = local_2b8.sa_data[5];
              __len = 0x10;
            }
            else {
              __len = 0;
              local_2b8._0_8_ = uVar6;
              if (uVar20 == 10) {
                local_2b8.sa_data._0_2_ = uVar27 << 8 | uVar27 >> 8;
                local_2b8.sa_family = 10;
                local_2b8.sa_data._2_4_ = 0;
LAB_00117c18:
                __len = 0x1c;
              }
            }
LAB_00117ead:
            setsockopt(iVar10,0,0x18,&local_2cc,4);
            iVar12 = bind(iVar10,&local_2b8,__len);
            uVar25 = uVar27;
            uVar20 = local_2d0;
            while (iVar12 < 0) {
              uVar27 = uVar27 + 1;
              if (((int)uVar20 < 2) || (uVar27 == 0)) {
                puVar18 = (uint *)__errno_location();
                uVar20 = *puVar18;
                (data->state).os_errno = uVar20;
                pcVar22 = Curl_strerror(uVar20,local_238,0x100);
                Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar20,pcVar22);
                goto LAB_001180c2;
              }
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar15 = (data->state).feat, pcVar15 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar15->log_level)))) {
                Curl_infof(data,"Bind to local port %d failed, trying next",(ulong)(uVar27 - 1));
              }
              local_2b8.sa_data._0_2_ = uVar27 * 0x100 | uVar27 >> 8;
              iVar12 = bind(iVar10,&local_2b8,__len);
              uVar25 = uVar25 + 1;
              uVar20 = uVar20 - 1;
            }
            if ((((data->set).field_0x897 & 0x40) != 0) &&
               ((pcVar15 = (data->state).feat, pcVar15 == (curl_trc_feat *)0x0 ||
                (0 < pcVar15->log_level)))) {
              Curl_infof(data,"Local port: %hu",(ulong)uVar25);
            }
            puVar1 = &(local_2c8->bits).field_0x2;
            *puVar1 = *puVar1 | 0x10;
            goto LAB_00117f2a;
          }
          local_2d8 = pcVar23;
          memset(local_238,0,0x100);
LAB_00117bbf:
          pcVar23 = local_2d8;
          if (local_2d8 == (char *)0x0) {
            iVar13 = Curl_if2ip(uVar20,uVar11,pcVar26->scope_id,pcVar24,local_238,0x100);
            if (iVar13 == IF2IP_FOUND) {
              pcVar23 = local_238;
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar15 = (data->state).feat, pcVar15 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar15->log_level)))) {
                Curl_infof(data,"Local Interface %s is ip %s using address family %i",pcVar24,
                           local_238,(ulong)uVar20);
              }
              if (pcVar19 == (char *)0x0) goto LAB_00117bcd;
              goto LAB_00117dcc;
            }
            if (iVar13 == IF2IP_AF_NOT_SUPPORTED) goto LAB_001180c7;
            pcVar23 = pcVar22;
            if (iVar13 != IF2IP_NOT_FOUND) {
              bVar28 = pcVar19 == (char *)0x0;
              pcVar19 = pcVar22;
              if (bVar28) goto LAB_00117bcd;
              goto LAB_0011807f;
            }
            if (pcVar19 == (char *)0x0) goto LAB_00117bcd;
            puVar18 = (uint *)__errno_location();
            uVar20 = *puVar18;
            (data->state).os_errno = uVar20;
            pcVar22 = Curl_strerror(uVar20,(char *)local_138,0x100);
            pcVar24 = "Couldn\'t bind to interface \'%s\' with errno %d: %s";
          }
          else {
LAB_00117bcd:
            uVar2 = pcVar26->ip_version;
            if (uVar20 == 2) {
              uVar8 = '\x01';
LAB_00117ca9:
              pcVar26->ip_version = uVar8;
            }
            else if (uVar20 == 10) {
              uVar8 = '\x02';
              goto LAB_00117ca9;
            }
            rVar14 = Curl_resolv(data,pcVar23,0x50,false,&local_2e0);
            if (rVar14 == CURLRESOLV_PENDING) {
              Curl_resolver_wait_resolv(data,&local_2e0);
            }
            pcVar26->ip_version = uVar2;
            pcVar19 = pcVar23;
            if (local_2e0 != (Curl_dns_entry *)0x0) {
              uVar11 = local_2e0->addr->ai_family;
              Curl_printable_address(local_2e0->addr,local_238,0x100);
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar15 = (data->state).feat, pcVar15 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar15->log_level)))) {
                Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",pcVar23,
                           (ulong)uVar20,local_238,(ulong)uVar11);
              }
              Curl_resolv_unlink(data,&local_2e0);
              iVar13 = IF2IP_AF_NOT_SUPPORTED;
              if (uVar11 != uVar20) goto LAB_001180c7;
LAB_00117dcc:
              __len = 0;
              if (uVar20 == 2) {
                iVar12 = inet_pton(2,local_238,local_2b8.sa_data + 2);
                if (0 < iVar12) {
                  goto LAB_00117e9f;
                }
              }
              else if (uVar20 == 10) {
                pcVar22 = strchr(local_238,0x25);
                local_138[0] = pcVar22;
                if (pcVar22 != (char *)0x0) {
                  local_138[0] = pcVar22 + 1;
                  *pcVar22 = '\0';
                }
                iVar12 = inet_pton(10,local_238,local_2b8.sa_data + 6);
                if (0 < iVar12) {
                  local_2b8.sa_data._0_2_ = uVar27 << 8 | uVar27 >> 8;
                  local_2b8.sa_family = 10;
                  if (pcVar22 != (char *)0x0) {
                    iVar12 = Curl_str_number(local_138,(curl_off_t *)local_2c0,0xffffffff);
                    if (iVar12 != 0) {
                      iVar13 = IF2IP_AF_NOT_SUPPORTED;
                      goto LAB_001180c7;
                    }
                    uStack_2a0 = CONCAT44(uStack_2a0._4_4_,local_2c0[0]);
                  }
                }
                goto LAB_00117c18;
              }
              goto LAB_00117ead;
            }
LAB_0011807f:
            puVar1 = &(data->state).field_0x7be;
            *puVar1 = *puVar1 & 0xdf;
            puVar18 = (uint *)__errno_location();
            uVar20 = *puVar18;
            (data->state).os_errno = uVar20;
            pcVar22 = Curl_strerror(uVar20,(char *)local_138,0x100);
            pcVar24 = "Couldn\'t bind to \'%s\' with errno %d: %s";
          }
          Curl_failf(data,pcVar24,pcVar19,(ulong)uVar20,pcVar22);
LAB_001180c2:
          iVar13 = 0x2d;
        }
        else {
          local_2d8 = pcVar23;
          sVar17 = strlen(pcVar24);
          iVar13 = 0x2b;
          if (sVar17 < 0xff) {
            bVar28 = local_2d8 != (char *)0x0;
            local_248 = 0;
            uStack_240 = 0;
            local_258 = 0;
            uStack_250 = 0;
            local_268 = 0;
            uStack_260 = 0;
            local_278 = 0;
            uStack_270 = 0;
            local_288 = 0;
            uStack_280 = 0;
            local_298 = 0;
            uStack_290 = 0;
            local_2a8 = 0;
            uStack_2a0 = 0;
            local_2b8.sa_family = 0;
            local_2b8.sa_data[0] = '\0';
            local_2b8.sa_data[1] = '\0';
            local_2b8.sa_data[2] = '\0';
            local_2b8.sa_data[3] = '\0';
            local_2b8.sa_data[4] = '\0';
            local_2b8.sa_data[5] = '\0';
            local_2b8.sa_data[6] = '\0';
            local_2b8.sa_data[7] = '\0';
            local_2b8.sa_data[8] = '\0';
            local_2b8.sa_data[9] = '\0';
            local_2b8.sa_data[10] = '\0';
            local_2b8.sa_data[0xb] = '\0';
            local_2b8.sa_data[0xc] = '\0';
            local_2b8.sa_data[0xd] = '\0';
            memset(local_238,0,0x100);
            iVar12 = setsockopt(iVar10,1,0x19,pcVar24,(int)sVar17 + 1);
            pcVar26 = local_2c8;
            if (iVar12 != 0 || bVar28) goto LAB_00117bbf;
            if ((((data->set).field_0x897 & 0x40) != 0) &&
               ((pcVar15 = (data->state).feat, pcVar15 == (curl_trc_feat *)0x0 ||
                (0 < pcVar15->log_level)))) {
              Curl_infof(data,"socket successfully bound to interface \'%s\'",pcVar24);
            }
            goto LAB_00117f2a;
          }
        }
LAB_001180c7:
        uVar21 = 7;
        if (iVar13 != IF2IP_AF_NOT_SUPPORTED) {
          uVar21 = (ulong)iVar13;
        }
        goto LAB_001177d3;
      }
    }
LAB_00117f2a:
    if ((data->set).fopensocket != (curl_opensocket_callback)0x0) {
      uVar21 = 1;
      iVar10 = curlx_nonblock(*sockfd,1);
      if (iVar10 < 0) {
        piVar16 = __errno_location();
        *(int *)((long)pvVar3 + 0x130) = *piVar16;
        goto LAB_001177d3;
      }
    }
    *(byte *)((long)pvVar3 + 0x134) =
         *(byte *)((long)pvVar3 + 0x134) & 0xf7 | (*(int *)((long)pvVar3 + 0xc) != 2) << 3;
    uVar21 = 0;
    if (bVar5) {
      set_local_ip((Curl_cfilter *)cf->ctx,data);
      cVar29 = Curl_now();
      *(time_t *)((long)pvVar3 + 0x110) = cVar29.tv_sec;
      *(int *)((long)pvVar3 + 0x118) = cVar29.tv_usec;
      cf->field_0x24 = cf->field_0x24 | 1;
    }
  }
  else {
LAB_001177d3:
    if (*sockfd != 0xffffffff) {
      socket_close(data,cf->conn,1,*sockfd);
      *sockfd = 0xffffffff;
    }
  }
  if (((data->set).field_0x897 & 0x40) != 0) {
    pcVar15 = (data->state).feat;
    if (pcVar15 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_00117840;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar15->log_level < 1)) goto LAB_00117840;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"cf_socket_open() -> %d, fd=%d",uVar21,(ulong)*sockfd);
    }
  }
LAB_00117840:
  return (CURLcode)uVar21;
}

Assistant:

static CURLcode cf_socket_open(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int error = 0;
  bool isconnected = FALSE;
  CURLcode result = CURLE_COULDNT_CONNECT;
  bool is_tcp;

  (void)data;
  DEBUGASSERT(ctx->sock == CURL_SOCKET_BAD);
  ctx->started_at = Curl_now();
#ifdef SOCK_NONBLOCK
  /* Do not tuck SOCK_NONBLOCK into socktype when opensocket callback is set
   * because we would not know how socketype is about to be used in the
   * callback, SOCK_NONBLOCK might get factored out before calling socket().
   */
  if(!data->set.fopensocket)
    ctx->addr.socktype |= SOCK_NONBLOCK;
#endif
  result = socket_open(data, &ctx->addr, &ctx->sock);
#ifdef SOCK_NONBLOCK
  /* Restore the socktype after the socket is created. */
  if(!data->set.fopensocket)
    ctx->addr.socktype &= ~SOCK_NONBLOCK;
#endif
  if(result)
    goto out;

  result = set_remote_ip(cf, data);
  if(result)
    goto out;

#ifdef USE_IPV6
  if(ctx->addr.family == AF_INET6) {
    set_ipv6_v6only(ctx->sock, 0);
    infof(data, "  Trying [%s]:%d...", ctx->ip.remote_ip, ctx->ip.remote_port);
  }
  else
#endif
    infof(data, "  Trying %s:%d...", ctx->ip.remote_ip, ctx->ip.remote_port);

#ifdef USE_IPV6
  is_tcp = (ctx->addr.family == AF_INET
            || ctx->addr.family == AF_INET6) &&
           ctx->addr.socktype == SOCK_STREAM;
#else
  is_tcp = (ctx->addr.family == AF_INET) &&
           ctx->addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, ctx->sock);

  nosigpipe(data, ctx->sock);

  Curl_sndbuf_init(ctx->sock);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, ctx->sock);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, TRUE);
    error = data->set.fsockopt(data->set.sockopt_client,
                               ctx->sock,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, FALSE);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

#ifndef CURL_DISABLE_BINDLOCAL
  /* possibly bind the local end to an IP, interface or port */
  if(ctx->addr.family == AF_INET
#ifdef USE_IPV6
     || ctx->addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, cf->conn, ctx->sock, ctx->addr.family,
                       Curl_ipv6_scope(&ctx->addr.curl_sa_addr));
    if(result) {
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        result = CURLE_COULDNT_CONNECT;
      }
      goto out;
    }
  }
#endif

#ifndef SOCK_NONBLOCK
  /* Set socket non-blocking, must be a non-blocking socket for
   * a non-blocking connect. */
  error = curlx_nonblock(ctx->sock, TRUE);
  if(error < 0) {
    result = CURLE_UNSUPPORTED_PROTOCOL;
    ctx->error = SOCKERRNO;
    goto out;
  }
#else
  if(data->set.fopensocket) {
    /* Set socket non-blocking, must be a non-blocking socket for
     * a non-blocking connect. */
    error = curlx_nonblock(ctx->sock, TRUE);
    if(error < 0) {
      result = CURLE_UNSUPPORTED_PROTOCOL;
      ctx->error = SOCKERRNO;
      goto out;
    }
  }
#endif
  ctx->sock_connected = (ctx->addr.socktype != SOCK_DGRAM);
out:
  if(result) {
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
  }
  else if(isconnected) {
    set_local_ip(cf, data);
    ctx->connected_at = Curl_now();
    cf->connected = TRUE;
  }
  CURL_TRC_CF(data, cf, "cf_socket_open() -> %d, fd=%" FMT_SOCKET_T,
              result, ctx->sock);
  return result;
}